

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# transaction.c
# Opt level: O0

int wally_tx_remove_output(wally_tx *tx,size_t index)

{
  _Bool _Var1;
  wally_tx_output *output_00;
  wally_tx_output *output;
  size_t index_local;
  wally_tx *tx_local;
  
  _Var1 = is_valid_tx(tx);
  if ((_Var1) && (index < tx->num_outputs)) {
    output_00 = tx->outputs + index;
    tx_output_free(output_00,false);
    if (index != tx->num_outputs - 1) {
      memmove(output_00,output_00 + 1,((tx->num_outputs - index) + -1) * 0x70);
    }
    wally_clear(tx->outputs + (tx->num_outputs - 1),0x70);
    tx->num_outputs = tx->num_outputs - 1;
    tx_local._4_4_ = 0;
  }
  else {
    tx_local._4_4_ = -2;
  }
  return tx_local._4_4_;
}

Assistant:

int wally_tx_remove_output(struct wally_tx *tx, size_t index)
{
    struct wally_tx_output *output;

    if (!is_valid_tx(tx) || index >= tx->num_outputs)
        return WALLY_EINVAL;

    output = tx->outputs + index;
    tx_output_free(output, false);
    if (index != tx->num_outputs - 1)
        memmove(output, output + 1,
                (tx->num_outputs - index - 1) * sizeof(*output));
    wally_clear(tx->outputs + tx->num_outputs - 1, sizeof(*output));

    tx->num_outputs -= 1;
    return WALLY_OK;
}